

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int get_big_cpu_data_cache_size(int level)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  long lVar3;
  
  uVar1 = 0;
  iVar4 = 0;
  iVar5 = 0;
  auVar2 = _DAT_00552350;
  do {
    uVar9 = g_cpu_affinity_mask_big.cpu_set.__bits[uVar1 >> 6];
    auVar7 = auVar2 & _DAT_00552e60;
    auVar8._8_4_ = auVar7._8_4_;
    auVar8._12_4_ = auVar7._12_4_;
    auVar8._0_8_ = auVar7._8_8_;
    auVar6._8_4_ = (int)uVar9;
    auVar6._0_8_ = uVar9;
    auVar6._12_4_ = (int)(uVar9 >> 0x20);
    uVar9 = 1L << auVar7._0_8_ & uVar9;
    uVar10 = 1L << auVar8._8_8_ & auVar6._8_8_;
    iVar4 = (iVar4 - (uint)((int)uVar9 == 0 && (int)(uVar9 >> 0x20) == 0)) + 1;
    iVar5 = (iVar5 - (uint)((int)uVar10 == 0 && (int)(uVar10 >> 0x20) == 0)) + 1;
    uVar1 = uVar1 + 2;
    lVar3 = auVar2._8_8_;
    auVar2._0_8_ = auVar2._0_8_ + 2;
    auVar2._8_8_ = lVar3 + 2;
  } while (uVar1 != 0x400);
  uVar1 = 0;
  if ((iVar5 + iVar4 != 0) && (0 < (long)g_cpucount)) {
    uVar1 = 0;
    do {
      if ((uVar1 < 0x400) &&
         ((g_cpu_affinity_mask_big.cpu_set.__bits[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0))
      goto LAB_00172980;
      uVar1 = uVar1 + 1;
    } while ((long)g_cpucount != uVar1);
    uVar1 = 0;
  }
LAB_00172980:
  iVar4 = get_data_cache_size((int)uVar1,level);
  return iVar4;
}

Assistant:

static int get_big_cpu_data_cache_size(int level)
{
    if (g_cpu_affinity_mask_big.num_enabled() == 0)
    {
        // smp cpu
        return get_data_cache_size(0, level);
    }

    for (int i = 0; i < g_cpucount; i++)
    {
        if (g_cpu_affinity_mask_big.is_enabled(i))
        {
            return get_data_cache_size(i, level);
        }
    }

    // should never reach here, fallback to cpu0
    return get_data_cache_size(0, level);
}